

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_ru_rep.cpp
# Opt level: O3

void __thiscall
RU_matrix_z2_rep_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
::test_method(RU_matrix_z2_rep_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
              *this)

{
  Underlying_matrix *this_00;
  Column_settings *pCVar1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  vStack_188;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>
  local_170;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>>
            ();
  local_170.colSettings_ = (Column_settings *)operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->list).ptr =
       (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->requested_size = 0x30
  ;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_)->max_size = 0;
  this_00 = &local_170.matrix_;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
              *)this_00,&vStack_188,local_170.colSettings_);
  test_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
            (&local_170);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
  ::reset(this_00,local_170.colSettings_);
  pCVar1 = local_170.colSettings_;
  if ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_ !=
      (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)local_170.colSettings_);
  }
  operator_delete(pCVar1,0x38);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
  ::~RU_matrix(this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&vStack_188);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(RU_matrix_z2_rep_representative_cycles, Matrix, full_matrices) {
  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns);
  test_representative_cycles<Matrix>(m);
}